

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void geopolyWithinFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  GeoPoly *pGVar2;
  GeoPoly *pGVar3;
  int *in_RDX;
  undefined4 in_ESI;
  sqlite3_context *in_RDI;
  int x;
  GeoPoly *p2;
  GeoPoly *p1;
  undefined4 in_stack_00000038;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffff0;
  
  pGVar2 = geopolyFuncParam(in_RDI,(sqlite3_value *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                            in_RDX);
  pGVar3 = geopolyFuncParam(in_RDI,(sqlite3_value *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                            in_RDX);
  if ((pGVar2 != (GeoPoly *)0x0) && (pGVar3 != (GeoPoly *)0x0)) {
    iVar1 = geopolyOverlap((GeoPoly *)context,(GeoPoly *)CONCAT44(argc,in_stack_00000038));
    if (iVar1 < 0) {
      sqlite3_result_error_nomem((sqlite3_context *)0x29ff41);
    }
    else {
      if (iVar1 == 2) {
        uVar4 = 1;
      }
      else {
        uVar4 = 0;
        if (iVar1 == 4) {
          uVar4 = 2;
        }
      }
      sqlite3_result_int((sqlite3_context *)CONCAT44(uVar4,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffbc);
    }
  }
  sqlite3_free((void *)0x29ff8e);
  sqlite3_free((void *)0x29ff98);
  return;
}

Assistant:

static void geopolyWithinFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  GeoPoly *p1 = geopolyFuncParam(context, argv[0], 0);
  GeoPoly *p2 = geopolyFuncParam(context, argv[1], 0);
  (void)argc;
  if( p1 && p2 ){
    int x = geopolyOverlap(p1, p2);
    if( x<0 ){
      sqlite3_result_error_nomem(context);
    }else{
      sqlite3_result_int(context, x==2 ? 1 : x==4 ? 2 : 0);
    }
  }
  sqlite3_free(p1);
  sqlite3_free(p2);
}